

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::detail::clone_if_necessary
          (detail *this,Boxed_Value *incoming,atomic_uint_fast32_t *t_loc,Dispatch_State *t_ss)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar4;
  Boxed_Value BVar5;
  string_view t_name;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  Type_Conversions_State local_30;
  
  peVar1 = (incoming->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->m_return_value == false) {
    if (((peVar1->m_type_info).m_flags & 0x10) == 0) {
      bVar3 = Type_Info::bare_equal_type_info(&peVar1->m_type_info,(type_info *)&bool::typeinfo);
      peVar1 = (incoming->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar3) {
        sVar4 = Boxed_Value::Object_Data::get<bool>
                          ((Object_Data *)this,*peVar1->m_const_data_ptr,false);
        t_loc = (atomic_uint_fast32_t *)
                sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      }
      else {
        bVar3 = Type_Info::bare_equal_type_info
                          (&peVar1->m_type_info,(type_info *)&std::__cxx11::string::typeinfo);
        if (bVar3) {
          Boxed_Value::Boxed_Value<std::__cxx11::string_const&,void>
                    ((Boxed_Value *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((incoming->m_data).
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_const_data_ptr,false);
          t_loc = (atomic_uint_fast32_t *)extraout_RDX_00;
        }
        else {
          local_48 = (incoming->m_data).
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
          p_Stack_40 = (incoming->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
          (incoming->m_data).
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_30.m_conversions._M_data = (Type_Conversions *)&local_48;
          (incoming->m_data).
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_30.m_saves._M_data = (Conversion_Saves *)&stack0xffffffffffffffc8;
          t_name._M_str = (char *)0x5;
          t_name._M_len = (size_t)(t_ss->m_engine)._M_data;
          BVar5 = chaiscript::detail::Dispatch_Engine::call_function
                            ((Dispatch_Engine *)this,t_name,(atomic_uint_fast32_t *)"clone",
                             (Function_Params *)t_loc,&local_30);
          t_loc = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
            t_loc = (atomic_uint_fast32_t *)extraout_RDX_01;
          }
        }
      }
    }
    else {
      Boxed_Number::clone((__fn *)this,incoming,(int)t_loc,t_ss);
      t_loc = (atomic_uint_fast32_t *)extraout_RDX;
    }
  }
  else {
    peVar1->m_return_value = false;
    *(element_type **)this = peVar1;
    p_Var2 = (incoming->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (incoming->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
    (incoming->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_loc;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Boxed_Value clone_if_necessary(Boxed_Value incoming, std::atomic_uint_fast32_t &t_loc, const chaiscript::detail::Dispatch_State &t_ss) {
        if (!incoming.is_return_value()) {
          if (incoming.get_type_info().is_arithmetic()) {
            return Boxed_Number::clone(incoming);
          } else if (incoming.get_type_info().bare_equal_type_info(typeid(bool))) {
            return Boxed_Value(*static_cast<const bool *>(incoming.get_const_ptr()));
          } else if (incoming.get_type_info().bare_equal_type_info(typeid(std::string))) {
            return Boxed_Value(*static_cast<const std::string *>(incoming.get_const_ptr()));
          } else {
            std::array<Boxed_Value, 1> params{std::move(incoming)};
            return t_ss->call_function("clone", t_loc, Function_Params{params}, t_ss.conversions());
          }
        } else {
          incoming.reset_return_value();
          return incoming;
        }
      }